

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

uint mp_eq_integer(mp_int *x,uintmax_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BignumInt BVar4;
  
  uVar1 = x->nw;
  uVar2 = 0;
  for (uVar3 = 0; uVar1 + (uVar1 == 0) != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 < uVar1) {
      BVar4 = x->w[uVar3];
    }
    else {
      BVar4 = 0;
    }
    uVar2 = uVar2 | BVar4 ^ n;
    n = 0;
  }
  return (uint)((uVar2 & 1) == 0 && uVar2 >> 1 == 0);
}

Assistant:

unsigned mp_eq_integer(mp_int *x, uintmax_t n)
{
    BignumInt diff = 0;
    size_t nwords = sizeof(n)/BIGNUM_INT_BYTES;
    for (size_t i = 0, e = size_t_max(x->nw, nwords); i < e; i++) {
        BignumInt nword = n;
        n = shift_right_by_one_word(n);
        diff |= mp_word(x, i) ^ nword;
    }
    return 1 ^ normalise_to_1(diff);   /* return 1 if diff _is_ zero */
}